

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_convolve_horiz_rs_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               int16_t *x_filters,int x0_qn,int x_step_qn)

{
  uint8_t uVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int k;
  int sum;
  int16_t *x_filter;
  int in_stack_00000018;
  int x_filter_idx;
  uint8_t *src_x;
  int x;
  int x_qn;
  int y;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined8 local_18;
  undefined8 local_8;
  
  local_8 = in_RDI + -3;
  local_18 = in_RDX;
  for (local_28 = 0; local_28 < in_R9D; local_28 = local_28 + 1) {
    local_2c = (uint)x_filter;
    for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 1) {
      local_4c = 0;
      for (local_50 = 0; local_50 < 8; local_50 = local_50 + 1) {
        local_4c = (uint)*(byte *)(local_8 + ((int)local_2c >> 0xe) + (long)local_50) *
                   (int)*(short *)(_k + (long)(((int)(local_2c & 0x3fff) >> 8) << 3) * 2 +
                                  (long)local_50 * 2) + local_4c;
      }
      uVar1 = clip_pixel(local_4c + 0x40 >> 7);
      *(uint8_t *)(local_18 + local_30) = uVar1;
      local_2c = in_stack_00000018 + local_2c;
    }
    local_8 = local_8 + in_ESI;
    local_18 = local_18 + in_ECX;
  }
  return;
}

Assistant:

void av1_convolve_horiz_rs_c(const uint8_t *src, int src_stride, uint8_t *dst,
                             int dst_stride, int w, int h,
                             const int16_t *x_filters, int x0_qn,
                             int x_step_qn) {
  src -= UPSCALE_NORMATIVE_TAPS / 2 - 1;
  for (int y = 0; y < h; ++y) {
    int x_qn = x0_qn;
    for (int x = 0; x < w; ++x) {
      const uint8_t *const src_x = &src[x_qn >> RS_SCALE_SUBPEL_BITS];
      const int x_filter_idx =
          (x_qn & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
      assert(x_filter_idx <= RS_SUBPEL_MASK);
      const int16_t *const x_filter =
          &x_filters[x_filter_idx * UPSCALE_NORMATIVE_TAPS];
      int sum = 0;
      for (int k = 0; k < UPSCALE_NORMATIVE_TAPS; ++k)
        sum += src_x[k] * x_filter[k];
      dst[x] = clip_pixel(ROUND_POWER_OF_TWO(sum, FILTER_BITS));
      x_qn += x_step_qn;
    }
    src += src_stride;
    dst += dst_stride;
  }
}